

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  ostream *poVar1;
  AssertionResult *pAVar2;
  int iVar3;
  size_t sVar4;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  undefined3 in_register_00000089;
  AssertionResult AVar6;
  AssertionResult local_60;
  AssertionResult *local_50;
  undefined4 local_44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_44 = CONCAT31(in_register_00000089,ignoring_case);
  local_50 = (AssertionResult *)this;
  Message::Message((Message *)&local_40);
  local_38 = local_40.ptr_;
  poVar1 = (ostream *)(local_40.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Value of: ",10);
  if (actual_expression == (char *)0x0) {
    sVar4 = 6;
    actual_expression = "(null)";
  }
  else {
    sVar4 = strlen(actual_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,actual_expression,sVar4);
  iVar3 = std::__cxx11::string::compare((char *)actual_value);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  Actual: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(actual_value->_M_dataplus)._M_p,actual_value->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nExpected: ",0xb);
  if (expected_expression == (char *)0x0) {
    sVar4 = 6;
    expected_expression = "(null)";
  }
  else {
    sVar4 = strlen(expected_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,expected_expression,sVar4);
  if ((char)local_44 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (ignoring case)",0x10);
  }
  iVar3 = std::__cxx11::string::compare((char *)expected_value);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nWhich is: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(expected_value->_M_dataplus)._M_p,expected_value->_M_string_length);
  }
  local_60.success_ = false;
  local_60.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_60,(Message *)&local_40);
  pAVar2 = local_50;
  AssertionResult::AssertionResult(local_50,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar5.ptr_ = extraout_RDX;
  if (local_40.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
    sVar5.ptr_ = extraout_RDX_00;
  }
  AVar6.message_.ptr_ = sVar5.ptr_;
  AVar6._0_8_ = pAVar2;
  return AVar6;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}